

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparse.c
# Opt level: O2

void print_symbols(MOJOSHADER_symbol *sym,uint symbol_count,uint indent)

{
  uint uVar1;
  
  do_indent(indent);
  printf("SYMBOLS:");
  if (symbol_count != 0) {
    putchar(10);
    for (uVar1 = 0; symbol_count != uVar1; uVar1 = uVar1 + 1) {
      do_indent(indent);
      printf("    * %d: \"%s\"\n",(ulong)uVar1,sym->name);
      do_indent(indent);
      printf("      register set %s\n",
             print_symbols_regsets_rel +
             *(int *)(print_symbols_regsets_rel + (ulong)sym->register_set * 4));
      do_indent(indent);
      printf("      register index %u\n",(ulong)sym->register_index);
      do_indent(indent);
      printf("      register count %u\n",(ulong)sym->register_count);
      print_typeinfo(&sym->info,indent);
      sym = sym + 1;
    }
    putchar(10);
    return;
  }
  puts(" (none.)");
  return;
}

Assistant:

static void print_symbols(const MOJOSHADER_symbol *sym,
                          const unsigned int symbol_count,
                          const unsigned int indent)
{
    INDENT(); printf("SYMBOLS:");
    if (symbol_count == 0)
        printf(" (none.)\n");
    else
    {
        int i;
        printf("\n");
        for (i = 0; i < symbol_count; i++, sym++)
        {
            static const char *regsets[] = {
                "bool", "int4", "float4", "sampler"
            };

            INDENT(); printf("    * %d: \"%s\"\n", i, sym->name);
            INDENT(); printf("      register set %s\n", regsets[sym->register_set]);
            INDENT(); printf("      register index %u\n", sym->register_index);
            INDENT(); printf("      register count %u\n", sym->register_count);
            print_typeinfo(&sym->info, indent);
        } // for
        printf("\n");
    } // else
}